

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_build_forward_impl(ggml_cgraph *cgraph,ggml_tensor *tensor,_Bool expand)

{
  undefined1 in_DL;
  ggml_cgraph *in_RSI;
  long in_RDI;
  int n_new;
  int n0;
  int iVar1;
  undefined3 in_stack_ffffffffffffffec;
  uint uVar2;
  
  uVar2 = CONCAT13(in_DL,in_stack_ffffffffffffffec) & 0x1ffffff;
  if ((char)(uVar2 >> 0x18) == '\0') {
    ggml_graph_clear((ggml_cgraph *)0x154687);
  }
  iVar1 = *(int *)(in_RDI + 4);
  ggml_visit_parents(in_RSI,(ggml_tensor *)CONCAT44(uVar2,iVar1));
  if ((0 < *(int *)(in_RDI + 4) - iVar1) &&
     (*(ggml_cgraph **)(*(long *)(in_RDI + 0x10) + (long)(*(int *)(in_RDI + 4) + -1) * 8) != in_RSI)
     ) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x16b3,"GGML_ASSERT(%s) failed","cgraph->nodes[cgraph->n_nodes - 1] == tensor");
  }
  return;
}

Assistant:

static void ggml_build_forward_impl(struct ggml_cgraph * cgraph, struct ggml_tensor * tensor, bool expand) {
    if (!expand) {
        // TODO: this branch isn't accessible anymore, maybe move this to ggml_build_forward_expand
        ggml_graph_clear(cgraph);
    }

    const int n0 = cgraph->n_nodes;

    ggml_visit_parents(cgraph, tensor);

    const int n_new = cgraph->n_nodes - n0;
    GGML_PRINT_DEBUG("%s: visited %d new nodes\n", __func__, n_new);

    if (n_new > 0) {
        // the last added node should always be starting point
        GGML_ASSERT(cgraph->nodes[cgraph->n_nodes - 1] == tensor);
    }
}